

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::computePrimalObjectiveValue(HEkk *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pcVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x24,0);
  (this->info_).primal_objective_value = 0.0;
  lVar7 = (long)(this->lp_).num_row_;
  if (0 < lVar7) {
    dVar9 = (this->info_).primal_objective_value;
    piVar3 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = (this->lp_).num_col_;
    pdVar4 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar2 = piVar3[lVar8];
      if (iVar2 < iVar1) {
        dVar9 = dVar9 + pdVar4[lVar8] * pdVar5[iVar2];
        (this->info_).primal_objective_value = dVar9;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  lVar7 = (long)(this->lp_).num_col_;
  if (0 < lVar7) {
    dVar9 = (this->info_).primal_objective_value;
    pcVar6 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      if (pcVar6[lVar8] != '\0') {
        dVar9 = dVar9 + pdVar4[lVar8] * pdVar5[lVar8];
        (this->info_).primal_objective_value = dVar9;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  (this->info_).primal_objective_value =
       this->cost_scale_ * (this->info_).primal_objective_value + (this->lp_).offset_;
  (this->status_).has_primal_objective_value = true;
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x24,0);
  return;
}

Assistant:

void HEkk::computePrimalObjectiveValue() {
  analysis_.simplexTimerStart(ComputePrObjClock);
  info_.primal_objective_value = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = basis_.basicIndex_[iRow];
    if (iVar < lp_.num_col_) {
      info_.primal_objective_value +=
          info_.baseValue_[iRow] * lp_.col_cost_[iVar];
    }
  }
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    if (basis_.nonbasicFlag_[iCol])
      info_.primal_objective_value +=
          info_.workValue_[iCol] * lp_.col_cost_[iCol];
  }
  info_.primal_objective_value *= cost_scale_;
  // Objective value calculation is done using primal values and
  // original costs so offset is vanilla
  info_.primal_objective_value += lp_.offset_;
  // Now have primal objective value
  status_.has_primal_objective_value = true;
  analysis_.simplexTimerStop(ComputePrObjClock);
}